

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_read_scatter_single(char *prefix,kvtree *data)

{
  int iVar1;
  uint uVar2;
  kvtree *pkVar3;
  char *__name;
  DIR *__dirp;
  dirent *pdVar4;
  byte bVar5;
  unsigned_long unaff_R13;
  kvtree *final_tree;
  kvtree *subfile_tree;
  unsigned_long local_20a0;
  unsigned_long level;
  char *prefix_file_copy;
  char *prefix_dir_copy;
  unsigned_long expected_ranks;
  regex_t regex;
  char tmp [4096];
  char pattern [4096];
  
  pkVar3 = kvtree_new();
  final_tree = pkVar3;
  iVar1 = kvtree_read_file(prefix,pkVar3);
  if (iVar1 == 0) {
    uVar2 = kvtree_util_get_unsigned_long(pkVar3,"RANKS",&expected_ranks);
    kvtree_delete(&final_tree);
    if (uVar2 == 0) {
      final_tree = kvtree_new();
      prefix_dir_copy = strdup(prefix);
      __name = dirname(prefix_dir_copy);
      prefix_file_copy = strdup(prefix);
      __xpg_basename(prefix_file_copy);
      snprintf(pattern,0x1000,"^%s\\.0\\.[0-9]+$");
      pattern[0xfff] = '\0';
      iVar1 = regcomp((regex_t *)&regex,pattern,1);
      bVar5 = 1;
      if ((iVar1 == 0) && (__dirp = opendir(__name), __dirp != (DIR *)0x0)) {
        unaff_R13 = 0;
        while (pdVar4 = readdir(__dirp), pdVar4 != (dirent *)0x0) {
          iVar1 = regexec((regex_t *)&regex,pdVar4->d_name,0,(regmatch_t *)0x0,0);
          if (iVar1 == 0) {
            local_20a0 = unaff_R13;
            memset(tmp,0,0x1000);
            snprintf(tmp,0x1000,"%s/%s");
            tmp[0xfff] = '\0';
            subfile_tree = kvtree_new();
            iVar1 = kvtree_read_file(tmp,subfile_tree);
            unaff_R13 = local_20a0;
            if ((((iVar1 == 0) &&
                 (iVar1 = kvtree_util_get_unsigned_long(subfile_tree,"LEVEL",&level),
                 unaff_R13 = local_20a0, iVar1 == 0)) && (level == 0)) &&
               ((pkVar3 = kvtree_extract(subfile_tree,"RANK"), pkVar3 != (kvtree *)0x0 &&
                (iVar1 = kvtree_merge(final_tree,pkVar3), iVar1 == 0)))) {
              iVar1 = kvtree_size(pkVar3);
              unaff_R13 = unaff_R13 + (long)iVar1;
            }
            kvtree_delete(&subfile_tree);
          }
        }
        closedir(__dirp);
        kvtree_merge(data,final_tree);
        bVar5 = 0;
      }
      kvtree_free(&prefix_dir_copy);
      kvtree_free(&prefix_file_copy);
      kvtree_delete(&final_tree);
      uVar2 = (uint)(unaff_R13 != expected_ranks | bVar5);
    }
    else {
      kvtree_err("Couldn\'t get RANKS for %s\n",prefix);
    }
  }
  else {
    kvtree_delete(&final_tree);
    kvtree_err("Couldn\'t read in high level kvtree file %s\n",prefix);
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int kvtree_read_scatter_single(const char* prefix, kvtree* data)
{
  /*
   * Read in high level kvtree.
   */
  kvtree* final_tree = kvtree_new();
  int rc = kvtree_read_file(prefix, final_tree);
  if (rc != KVTREE_SUCCESS) {
    kvtree_delete(&final_tree);
    kvtree_err("Couldn't read in high level kvtree file %s\n", prefix);
    return rc;
  }

  unsigned long expected_ranks;
  rc = kvtree_util_get_unsigned_long(final_tree, "RANKS", &expected_ranks);
  if (rc != KVTREE_SUCCESS) {
    kvtree_delete(&final_tree);
    kvtree_err("Couldn't get RANKS for %s\n", prefix);
    return rc;
  }
  kvtree_delete(&final_tree);

  /* Start construction of the final tree that we will return */
  final_tree = kvtree_new();

  /* Look at all the subfiles with our prefix and read in the file lists */
  char* prefix_dir_copy = strdup(prefix);
  char* prefix_dir = dirname(prefix_dir_copy);
  char* prefix_file_copy = strdup(prefix);
  char* prefix_file = basename(prefix_file_copy);

  /* Create our regex to match our prefix files */
  char pattern[PATH_MAX];
  snprintf(pattern, sizeof(pattern), "^%s\\.0\\.[0-9]+$", prefix_file);
  pattern[sizeof(pattern) - 1] = '\0';

  regex_t regex;
  rc = regcomp(&regex, pattern, REG_EXTENDED);
  if (rc) {
    rc = KVTREE_FAILURE;
    goto end;
  }

  DIR* d = opendir(prefix_dir);
  if (!d) {
    rc = KVTREE_FAILURE;
    goto end;
  }

  /* For each file/dir in our prefix dir */
  unsigned long actual_ranks = 0;
  struct dirent* dir;
  while ((dir = readdir(d)) != NULL) {
    /*
     * Search for any file starting with "prefix_file."
     * like "rank2file.".
     */
    /* Is this one of our subfiles?  It should have .0.x in the extension */
    rc = regexec(&regex, dir->d_name, 0, NULL, 0);
    if (rc == 0) {  /* Did we get both numbers in the extension? */
      /* subfile matches */

      /* Construct the full path to the subfile kvtree */
      char tmp[PATH_MAX];
      memset(tmp, 0, sizeof(tmp));
      snprintf(tmp, sizeof(tmp), "%s/%s", prefix_dir, dir->d_name);
      tmp[sizeof(tmp) - 1] = '\0';

      /* Read in the subfile */
      kvtree* subfile_tree = kvtree_new();
      rc = kvtree_read_file(tmp, subfile_tree);
      if (rc == KVTREE_SUCCESS) {
        /* Sanity: each subfile we want will have LEVEL=0 */
        unsigned long level;
        rc = kvtree_util_get_unsigned_long(subfile_tree, "LEVEL", &level);
        if (rc == KVTREE_SUCCESS && level == 0) {
          /* Break off and remove the "RANK" subtree from the rank2file tree */
          kvtree* subfile_rank_tree = kvtree_extract(subfile_tree, "RANK");
          if (subfile_rank_tree) {
            if (kvtree_merge(final_tree, subfile_rank_tree) == KVTREE_SUCCESS) {
              actual_ranks += kvtree_size(subfile_rank_tree);
            }
          }
        }
      }
      kvtree_delete(&subfile_tree);
    }
  }
  closedir(d);
  kvtree_merge(data, final_tree);
  rc = KVTREE_SUCCESS;

end:
  kvtree_free(&prefix_dir_copy);
  kvtree_free(&prefix_file_copy);
  kvtree_delete(&final_tree);
  if (rc != KVTREE_SUCCESS || actual_ranks != expected_ranks) {
    return KVTREE_FAILURE;
  }

  return KVTREE_SUCCESS;
}